

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall testing::internal::WideStringToUtf8(internal *this,wchar_t *str,int num_chars)

{
  wchar_t code_point;
  size_t sVar1;
  size_t extraout_RDX;
  long lVar2;
  bool bVar3;
  String SVar4;
  char buffer [32];
  stringstream stream;
  char local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (num_chars == -1) {
    sVar1 = wcslen(str);
    num_chars = (int)sVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (0 < num_chars) {
    lVar2 = 0;
    while (code_point = str[lVar2], code_point != L'\0') {
      CodePointToUtf8(code_point,local_1d8);
      sVar1 = strlen(local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_1d8,sVar1);
      if ((code_point == L'\0') ||
         (bVar3 = (ulong)(uint)num_chars - 1 == lVar2, lVar2 = lVar2 + 1, bVar3)) break;
    }
  }
  StringStreamToString(this,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    char buffer[32];  // CodePointToUtf8 requires a buffer this big.
    stream << CodePointToUtf8(unicode_code_point, buffer);
  }
  return StringStreamToString(&stream);
}